

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O2

int libssh2_userauth_hostbased_fromfile_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,char *publickey,char *privatekey,
              char *passphrase,char *host,uint host_len,char *localuser,uint localuser_len)

{
  uchar **buf_00;
  uchar **data;
  libssh2_nonblocking_states lVar1;
  _func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *p_Var2;
  LIBSSH2_HOSTKEY_METHOD *pLVar3;
  int iVar4;
  time_t start_time;
  uchar *puVar5;
  long lVar6;
  char *errmsg;
  size_t sVar7;
  size_t pubkeydata_len;
  uchar *pubkeydata;
  size_t sig_len;
  uchar *sig;
  void *abstract;
  char *local_c8;
  char *local_c0;
  size_t *local_b8;
  uchar **local_b0;
  ulong local_a8;
  char *local_a0;
  long local_98;
  char *local_90;
  LIBSSH2_HOSTKEY_METHOD *privkeyobj;
  uchar buf [5];
  iovec datavec [4];
  
  local_c8 = privatekey;
  local_c0 = passphrase;
  local_a0 = user;
  local_90 = publickey;
  start_time = time((time_t *)0x0);
  local_a8 = (ulong)user_len;
  local_b0 = &session->userauth_host_method;
  local_b8 = &session->userauth_host_method_len;
  local_98 = local_a8 + host_len + (ulong)localuser_len;
  buf_00 = &session->userauth_host_s;
  data = &session->userauth_host_data;
  do {
    lVar1 = session->userauth_host_state;
    if (lVar1 == libssh2_NB_state_sent) {
LAB_00114397:
      iVar4 = _libssh2_packet_requirev
                        (session,"43",data,(size_t *)datavec,0,(uchar *)0x0,0,
                         &session->userauth_host_packet_requirev_state);
      if (iVar4 == -0x25) {
LAB_001143c6:
        iVar4 = -0x25;
        errmsg = "Would block";
        goto LAB_00114421;
      }
      session->userauth_host_state = libssh2_NB_state_idle;
      if ((iVar4 != 0) || (datavec[0].iov_base == (void *)0x0)) {
        iVar4 = -0x13;
        errmsg = "Auth failed";
        goto LAB_00114421;
      }
      puVar5 = *data;
      if (*puVar5 != '4') goto LAB_00113f5c;
      (*session->free)(puVar5,&session->abstract);
      session->userauth_host_data = (uchar *)0x0;
      *(byte *)&session->state = (byte)session->state | 8;
      iVar4 = 0;
    }
    else {
      if (lVar1 == libssh2_NB_state_created) {
LAB_0011431b:
        iVar4 = _libssh2_transport_send
                          (session,session->userauth_host_packet,
                           (long)session->userauth_host_s - (long)session->userauth_host_packet,
                           (uchar *)0x0,0);
        if (iVar4 == 0) {
          (*session->free)(session->userauth_host_packet,&session->abstract);
          session->userauth_host_packet = (uchar *)0x0;
          session->userauth_host_state = libssh2_NB_state_sent;
          goto LAB_00114397;
        }
        if (iVar4 == -0x25) goto LAB_001143c6;
        (*session->free)(session->userauth_host_packet,&session->abstract);
        session->userauth_host_packet = (uchar *)0x0;
        session->userauth_host_state = libssh2_NB_state_idle;
        iVar4 = -7;
        errmsg = "Unable to send userauth-hostbased request";
      }
      else {
        if (lVar1 == libssh2_NB_state_idle) {
          pubkeydata = (uchar *)0x0;
          sig = (uchar *)0x0;
          pubkeydata_len = 0;
          sig_len = 0;
          (session->userauth_host_packet_requirev_state).start = 0;
          if (local_90 == (char *)0x0) {
            iVar4 = _libssh2_pub_priv_keyfile
                              (session,local_b0,local_b8,&pubkeydata,&pubkeydata_len,local_c8,
                               local_c0);
          }
          else {
            iVar4 = file_read_publickey(session,local_b0,local_b8,&pubkeydata,&pubkeydata_len,
                                        local_90);
          }
          if (iVar4 == 0) {
            lVar6 = local_98 + session->userauth_host_method_len;
            session->userauth_host_packet_len = pubkeydata_len + lVar6 + 0x34;
            puVar5 = (uchar *)(*session->alloc)(pubkeydata_len * 2 +
                                                session->userauth_host_method_len + lVar6 + 0x40,
                                                &session->abstract);
            session->userauth_host_packet = puVar5;
            session->userauth_host_s = puVar5;
            if (puVar5 == (uchar *)0x0) {
              (*session->free)(session->userauth_host_method,&session->abstract);
              session->userauth_host_method = (uchar *)0x0;
              (*session->free)(pubkeydata,&session->abstract);
              iVar4 = -6;
              errmsg = "Out of memory";
              goto LAB_00114421;
            }
            session->userauth_host_s = puVar5 + 1;
            *puVar5 = '2';
            _libssh2_store_str(buf_00,local_a0,local_a8);
            _libssh2_store_str(buf_00,"ssh-connection",0xe);
            _libssh2_store_str(buf_00,"hostbased",9);
            _libssh2_store_str(buf_00,(char *)session->userauth_host_method,
                               session->userauth_host_method_len);
            _libssh2_store_str(buf_00,(char *)pubkeydata,pubkeydata_len);
            (*session->free)(pubkeydata,&session->abstract);
            _libssh2_store_str(buf_00,host,(ulong)host_len);
            _libssh2_store_str(buf_00,localuser,(ulong)localuser_len);
            iVar4 = file_read_privatekey
                              (session,&privkeyobj,&abstract,session->userauth_host_method,
                               session->userauth_host_method_len,local_c8,local_c0);
            if (iVar4 == 0) {
              _libssh2_htonu32(buf,session->session_id_len);
              pLVar3 = privkeyobj;
              datavec[0].iov_len = 4;
              datavec[1].iov_base = session->session_id;
              datavec[1].iov_len = (size_t)session->session_id_len;
              datavec[2].iov_base = session->userauth_host_packet;
              datavec[2].iov_len = session->userauth_host_packet_len;
              datavec[0].iov_base = buf;
              if (privkeyobj != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
                if ((privkeyobj->signv !=
                     (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_int_iovec_ptr_void_ptr_ptr
                      *)0x0) &&
                   (iVar4 = (*privkeyobj->signv)(session,&sig,&sig_len,3,datavec,&abstract),
                   iVar4 != 0)) {
                  (*session->free)(session->userauth_host_method,&session->abstract);
                  session->userauth_host_method = (uchar *)0x0;
                  (*session->free)(session->userauth_host_packet,&session->abstract);
                  session->userauth_host_packet = (uchar *)0x0;
                  p_Var2 = pLVar3->dtor;
                  iVar4 = -1;
                  if (p_Var2 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                    (*p_Var2)(session,&abstract);
                    iVar4 = -1;
                  }
                  goto LAB_00114429;
                }
                p_Var2 = pLVar3->dtor;
                if (p_Var2 != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                  (*p_Var2)(session,&abstract);
                }
              }
              puVar5 = session->userauth_host_packet;
              if (pubkeydata_len < sig_len) {
                sVar7 = session->userauth_host_method_len +
                        sig_len + session->userauth_host_packet_len + 0xc;
                if (puVar5 == (uchar *)0x0) {
                  puVar5 = (uchar *)(*session->alloc)(sVar7,&session->abstract);
                }
                else {
                  puVar5 = (uchar *)(*session->realloc)(puVar5,sVar7,&session->abstract);
                }
                if (puVar5 == (uchar *)0x0) {
                  (*session->free)(sig,&session->abstract);
                  (*session->free)(session->userauth_host_packet,&session->abstract);
                  session->userauth_host_packet = (uchar *)0x0;
                  (*session->free)(session->userauth_host_method,&session->abstract);
                  session->userauth_host_method = (uchar *)0x0;
                  iVar4 = -6;
                  errmsg = "Failed allocating additional space for userauth-hostbased packet";
                  goto LAB_00114421;
                }
                session->userauth_host_packet = puVar5;
              }
              session->userauth_host_s = puVar5 + session->userauth_host_packet_len;
              _libssh2_store_u32(buf_00,(int)sig_len + (int)session->userauth_host_method_len + 8);
              _libssh2_store_str(buf_00,(char *)session->userauth_host_method,
                                 session->userauth_host_method_len);
              (*session->free)(session->userauth_host_method,&session->abstract);
              session->userauth_host_method = (uchar *)0x0;
              _libssh2_store_str(buf_00,(char *)sig,sig_len);
              (*session->free)(sig,&session->abstract);
              session->userauth_host_state = libssh2_NB_state_created;
              goto LAB_0011431b;
            }
            (*session->free)(session->userauth_host_method,&session->abstract);
            session->userauth_host_method = (uchar *)0x0;
            (*session->free)(session->userauth_host_packet,&session->abstract);
            session->userauth_host_packet = (uchar *)0x0;
          }
          goto LAB_00114429;
        }
        puVar5 = *data;
LAB_00113f5c:
        (*session->free)(puVar5,&session->abstract);
        session->userauth_host_data = (uchar *)0x0;
        iVar4 = -0x13;
        errmsg = "Invalid signature for supplied public key, or bad username/public key combination"
        ;
      }
LAB_00114421:
      iVar4 = _libssh2_error(session,iVar4,errmsg);
    }
LAB_00114429:
    if (iVar4 != -0x25) {
      return iVar4;
    }
    if (session->api_block_mode == 0) {
      return -0x25;
    }
    iVar4 = _libssh2_wait_socket(session,start_time);
    if (iVar4 != 0) {
      return iVar4;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_userauth_hostbased_fromfile_ex(LIBSSH2_SESSION *session,
                                       const char *user,
                                       unsigned int user_len,
                                       const char *publickey,
                                       const char *privatekey,
                                       const char *passphrase,
                                       const char *host,
                                       unsigned int host_len,
                                       const char *localuser,
                                       unsigned int localuser_len)
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_hostbased_fromfile(session, user, user_len,
                                             publickey, privatekey,
                                             passphrase, host, host_len,
                                             localuser, localuser_len));
    return rc;
}